

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResolvingDecoder.cc
# Opt level: O0

double __thiscall
avro::parsing::
ResolvingDecoderImpl<avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>_>::
decodeDouble(ResolvingDecoderImpl<avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>_>
             *this)

{
  Kind KVar1;
  int iVar2;
  type pDVar3;
  undefined4 extraout_var;
  long in_RDI;
  float extraout_XMM0_Da;
  double extraout_XMM0_Qa;
  Kind k;
  Kind in_stack_00000264;
  SimpleParser<avro::parsing::ResolvingDecoderHandler> *in_stack_00000268;
  double local_30;
  double local_28;
  double local_20;
  
  KVar1 = SimpleParser<avro::parsing::ResolvingDecoderHandler>::advance
                    (in_stack_00000268,in_stack_00000264);
  if (KVar1 == sInt) {
    pDVar3 = boost::shared_ptr<avro::Decoder>::operator->((shared_ptr<avro::Decoder> *)(in_RDI + 8))
    ;
    iVar2 = (*pDVar3->_vptr_Decoder[5])();
    local_20 = (double)iVar2;
  }
  else {
    if (KVar1 == sLong) {
      pDVar3 = boost::shared_ptr<avro::Decoder>::operator->
                         ((shared_ptr<avro::Decoder> *)(in_RDI + 8));
      iVar2 = (*pDVar3->_vptr_Decoder[6])();
      local_28 = (double)CONCAT44(extraout_var,iVar2);
    }
    else {
      if (KVar1 == sFloat) {
        pDVar3 = boost::shared_ptr<avro::Decoder>::operator->
                           ((shared_ptr<avro::Decoder> *)(in_RDI + 8));
        (*pDVar3->_vptr_Decoder[7])();
        local_30 = (double)extraout_XMM0_Da;
      }
      else {
        pDVar3 = boost::shared_ptr<avro::Decoder>::operator->
                           ((shared_ptr<avro::Decoder> *)(in_RDI + 8));
        (*pDVar3->_vptr_Decoder[8])();
        local_30 = extraout_XMM0_Qa;
      }
      local_28 = local_30;
    }
    local_20 = local_28;
  }
  return local_20;
}

Assistant:

double ResolvingDecoderImpl<P>::decodeDouble()
{
    Symbol::Kind k = parser_.advance(Symbol::sDouble);
    return k == Symbol::sInt ? base_->decodeInt() :
        k == Symbol::sLong ? base_->decodeLong() :
        k == Symbol::sFloat ? base_->decodeFloat() :
        base_->decodeDouble();
}